

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O0

void __thiscall
TPZMatrix<long>::AutoFill(TPZMatrix<long> *this,int64_t nrow,int64_t ncol,int symmetric)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  int64_t iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  int in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZBaseMatrix *in_RDI;
  __type_conflict _Var7;
  __type_conflict _Var8;
  long sum;
  long val;
  int64_t j;
  int64_t i;
  char *in_stack_00000168;
  char *in_stack_00000170;
  undefined8 local_58;
  long local_50;
  undefined8 local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  int local_1c;
  
  local_1c = in_ECX;
  (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0xd])(in_RDI,in_RSI,in_RDX);
  for (local_28 = 0; lVar1 = local_28, iVar5 = TPZBaseMatrix::Rows(in_RDI), lVar1 < iVar5;
      local_28 = local_28 + 1) {
    local_40 = 0;
    local_30 = 0;
    if (local_1c != 0) {
      for (; lVar2 = local_28, lVar1 = local_30, local_30 < local_28; local_30 = local_30 + 1) {
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_30,local_28);
        local_48 = CONCAT44(extraout_var,iVar4);
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,lVar2,lVar1,&local_48);
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_30);
        _Var7 = std::fabs<long>(CONCAT44(extraout_var_00,iVar4));
        local_40 = (long)((double)local_40 + _Var7);
      }
    }
    for (; lVar1 = local_30, iVar5 = TPZBaseMatrix::Cols(in_RDI), lVar1 < iVar5;
        local_30 = local_30 + 1) {
      local_38 = GetRandomVal((TPZMatrix<long> *)0x12e2cdf);
      if (local_28 != local_30) {
        _Var7 = std::fabs<long>(local_38);
        local_40 = (long)((double)local_40 + _Var7);
      }
      iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])
                        (in_RDI,local_28,local_30,&local_38);
      if (iVar4 == 0) {
        Error(in_stack_00000170,in_stack_00000168);
      }
    }
    iVar5 = TPZBaseMatrix::Rows(in_RDI);
    iVar6 = TPZBaseMatrix::Cols(in_RDI);
    if (iVar5 == iVar6) {
      _Var7 = std::fabs<long>(local_40);
      iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
      _Var8 = std::fabs<long>(CONCAT44(extraout_var_01,iVar4));
      if (_Var8 < _Var7) {
        local_50 = local_40 + 1;
        (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_50);
      }
      bVar3 = IsZero(local_40);
      if (bVar3) {
        iVar4 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x24])(in_RDI,local_28,local_28);
        bVar3 = IsZero(CONCAT44(extraout_var_02,iVar4));
        if (bVar3) {
          local_58 = 1;
          (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x23])(in_RDI,local_28,local_28,&local_58);
        }
      }
    }
  }
  return;
}

Assistant:

void TPZMatrix<TVar>::AutoFill(int64_t nrow, int64_t ncol, int symmetric) {
    Resize(nrow,ncol);
	int64_t i, j;
	TVar val, sum;
	/** Fill data */
	for(i=0;i<Rows();i++) {
		sum = 0.0;
        j=0;
        if (symmetric) {
            for (; j<i; j++) {
                if constexpr (is_complex<TVar>::value){
                    //hermitian matrices
                    PutVal(i, j, std::conj(GetVal(j,i)));
                }else{
                    PutVal(i, j, GetVal(j,i));
                }
                sum += fabs(GetVal(i, j));
            }
        }
		for(;j<Cols();j++) {
			val = GetRandomVal();
            if constexpr(is_complex<TVar>::value){
                if(j==i) val = fabs(val);
            }
            if(i!=j) sum += fabs(val);
			if(!PutVal(i,j,val))
				Error("AutoFill (TPZMatrix) failed.");
			
		}
		if (Rows() == Cols()) {
		  /** Making diagonally dominant and non zero in diagonal */
		  if(fabs(sum) > fabs(GetVal(i,i)))            // Deve satisfazer:  |Aii| > SUM( |Aij| )  sobre j != i
			  PutVal(i,i,sum+(TVar)1.);
		  // To sure diagonal is not zero.
		  if(IsZero(sum) && IsZero(GetVal(i,i)))
			  PutVal(i,i,1.);
		}
	}
}